

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void rftfsub(int n,double *a,int nc,double *c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double yi;
  double yr;
  double xi;
  double xr;
  double wki;
  double wkr;
  int m;
  int ks;
  int kk;
  int k;
  int j;
  double *c_local;
  int nc_local;
  double *a_local;
  int n_local;
  
  m = 0;
  for (kk = 2; kk < n >> 1; kk = kk + 2) {
    iVar1 = n - kk;
    m = (nc << 1) / (n >> 1) + m;
    dVar2 = (0.5 - c[nc - m]) * (a[kk] - a[iVar1]) + -(c[m] * (a[kk + 1] + a[iVar1 + 1]));
    dVar3 = (0.5 - c[nc - m]) * (a[kk + 1] + a[iVar1 + 1]) + c[m] * (a[kk] - a[iVar1]);
    a[kk] = a[kk] - dVar2;
    a[kk + 1] = a[kk + 1] - dVar3;
    a[iVar1] = dVar2 + a[iVar1];
    a[iVar1 + 1] = a[iVar1 + 1] - dVar3;
  }
  return;
}

Assistant:

void rftfsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr, xi, yr, yi;

  m = n >> 1;
  ks = 2 * nc / m;
  kk = 0;
  for (j = 2; j < m; j += 2) {
    k = n - j;
    kk += ks;
    wkr = 0.5 - c[nc - kk];
    wki = c[kk];
    xr = a[j] - a[k];
    xi = a[j + 1] + a[k + 1];
    yr = wkr * xr - wki * xi;
    yi = wkr * xi + wki * xr;
    a[j] -= yr;
    a[j + 1] -= yi;
    a[k] += yr;
    a[k + 1] -= yi;
  }
}